

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char>::visit_bool
          (ArgFormatterBase<fmt::ArgFormatter<char>,_char> *this,bool value)

{
  size_t in_RCX;
  void *in_RDX;
  byte in_SIL;
  ArgFormatterBase<fmt::ArgFormatter<char>,_char> *in_RDI;
  bool in_stack_0000001f;
  ArgFormatterBase<fmt::ArgFormatter<char>,_char> *in_stack_00000020;
  
  if (in_RDI->spec_->type_ == '\0') {
    write(in_RDI,(uint)(in_SIL & 1),in_RDX,in_RCX);
  }
  else {
    visit_any_int<bool>(in_stack_00000020,in_stack_0000001f);
  }
  return;
}

Assistant:

void visit_bool(bool value) {
    if (spec_.type_)
      return visit_any_int(value);
    write(value);
  }